

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-split.cpp
# Opt level: O0

bool __thiscall split_strategy::should_split(split_strategy *this,int i_tensor,size_t next_size)

{
  ulong in_RDX;
  int in_ESI;
  long in_RDI;
  bool local_29;
  bool local_1;
  
  if (*(char *)(in_RDI + 1) == '\x02') {
    local_1 = *(ulong *)(in_RDI + 8) < in_RDX;
  }
  else if (*(char *)(in_RDI + 1) == '\x01') {
    local_29 = false;
    if ((0 < in_ESI) && (local_29 = false, in_ESI < *(int *)(in_RDI + 0x78))) {
      local_29 = in_ESI % *(int *)(in_RDI + 0x10) == 0;
    }
    local_1 = local_29;
  }
  else {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/gguf-split/gguf-split.cpp"
               ,0x11f,"invalid mode");
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool should_split(int i_tensor, size_t next_size) {
        if (params.mode == MODE_SIZE) {
            // split by max size per file
            return next_size > params.n_bytes_split;
        } else if (params.mode == MODE_TENSOR) {
            // split by number of tensors per file
            return i_tensor > 0 && i_tensor < n_tensors && i_tensor % params.n_split_tensors == 0;
        }
        // should never happen
        GGML_ABORT("invalid mode");
    }